

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemoryRegionSection * phys_page_find(AddressSpaceDispatch *d,hwaddr addr)

{
  _Bool _Var1;
  bool bVar2;
  int local_4c;
  int i;
  hwaddr index;
  MemoryRegionSection *sections;
  Node *nodes;
  PhysPageEntry *p;
  PhysPageEntry lp;
  hwaddr addr_local;
  AddressSpaceDispatch *d_local;
  
  p._4_4_ = d->phys_map;
  d_local = (AddressSpaceDispatch *)(d->map).sections;
  local_4c = 6;
  while( true ) {
    bVar2 = false;
    if (((uint)p._4_4_ & 0x3f) != 0) {
      local_4c = local_4c - ((uint)p._4_4_ & 0x3f);
      bVar2 = -1 < local_4c;
    }
    if (!bVar2) break;
    if ((uint)p._4_4_ >> 6 == 0x3ffffff) {
      return (MemoryRegionSection *)d_local;
    }
    p._4_4_ = (d->map).nodes[(uint)p._4_4_ >> 6]
              [(addr >> 0xe) >> ((char)local_4c * '\t' & 0x3fU) & 0x1ff];
  }
  _Var1 = section_covers_addr((MemoryRegionSection *)
                              ((long)d_local + (ulong)((uint)p._4_4_ >> 6) * 0x40),addr);
  if (_Var1) {
    d_local = (AddressSpaceDispatch *)((long)d_local + (ulong)((uint)p._4_4_ >> 6) * 0x40);
  }
  return (MemoryRegionSection *)d_local;
}

Assistant:

static MemoryRegionSection *phys_page_find(AddressSpaceDispatch *d, hwaddr addr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = d->uc;
#endif
    PhysPageEntry lp = d->phys_map, *p;
    Node *nodes = d->map.nodes;
    MemoryRegionSection *sections = d->map.sections;
    hwaddr index = addr >> TARGET_PAGE_BITS;
    int i;

    for (i = P_L2_LEVELS; lp.skip && (i -= lp.skip) >= 0;) {
        if (lp.ptr == PHYS_MAP_NODE_NIL) {
            return &sections[PHYS_SECTION_UNASSIGNED];
        }
        p = nodes[lp.ptr];
        lp = p[(index >> (i * P_L2_BITS)) & (P_L2_SIZE - 1)];
    }

    if (section_covers_addr(&sections[lp.ptr], addr)) {
        return &sections[lp.ptr];
    } else {
        return &sections[PHYS_SECTION_UNASSIGNED];
    }
}